

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprandomrand48.cpp
# Opt level: O0

double __thiscall jrtplib::RTPRandomRand48::GetRandomDouble(RTPRandomRand48 *this)

{
  double y;
  int64_t x;
  RTPRandomRand48 *this_local;
  
  this->state = this->state * 0x5deece66d + 0xb & 0xffffffffffff;
  return (double)(long)this->state * 3.552713678800501e-15;
}

Assistant:

double RTPRandomRand48::GetRandomDouble()
{
#ifdef RTP_SUPPORT_THREAD
	mutex.Lock();
#endif // RTP_SUPPORT_THREAD

#ifdef RTP_HAVE_VSUINT64SUFFIX
	state = ((0x5DEECE66Dui64*state) + 0xBui64)&0x0000ffffffffffffui64;

	int64_t x = (int64_t)state;
#else
	state = ((0x5DEECE66DULL*state) + 0xBULL)&0x0000ffffffffffffULL;

	int64_t x = (int64_t)state;
#endif // RTP_HAVE_VSUINT64SUFFIX

#ifdef RTP_SUPPORT_THREAD
	mutex.Unlock();
#endif // RTP_SUPPORT_THREAD
	double y = 3.552713678800500929355621337890625e-15 * (double)x;
	return y;
}